

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Vector3 Vector3Barycenter(Vector3 p,Vector3 a,Vector3 b,Vector3 c)

{
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar1;
  float in_XMM1_Db;
  float fVar4;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_XMM7_Db;
  float fVar16;
  float fVar17;
  float fVar18;
  Vector3 VVar19;
  
  fVar6 = a.z;
  fVar18 = a.x;
  fVar8 = b.x - fVar18;
  fVar5 = a.y;
  fVar9 = b.y - fVar5;
  fVar10 = b.z - fVar6;
  fVar1 = p.z - fVar6;
  fVar4 = c.z - fVar6;
  fVar7 = fVar10 * fVar10 + fVar8 * fVar8 + fVar9 * fVar9;
  fVar15 = p.x - fVar18;
  fVar16 = c.x - fVar18;
  fVar17 = p.y - fVar18;
  fVar18 = c.y - fVar18;
  fVar13 = p.y - fVar5;
  fVar14 = c.y - fVar5;
  fVar11 = fVar10 * fVar1 + fVar8 * fVar15 + fVar9 * fVar13;
  fVar12 = fVar10 * fVar4 + fVar8 * fVar16 + fVar9 * fVar14;
  fVar1 = fVar4 * fVar1 + fVar16 * fVar15 + fVar14 * fVar13;
  fVar13 = fVar4 * fVar4 + fVar16 * fVar16 + fVar14 * fVar14;
  fVar15 = fVar7 * fVar13 - fVar12 * fVar12;
  auVar2._4_4_ = fVar13 * fVar11 - fVar1 * fVar12;
  auVar2._0_4_ = fVar7 * fVar1 - fVar12 * fVar11;
  auVar2._8_4_ = fVar7 * (fVar4 * (in_XMM1_Db - fVar6) +
                         fVar16 * fVar17 + fVar14 * (in_XMM0_Dc - fVar5)) -
                 fVar12 * (fVar10 * (in_XMM1_Db - fVar6) +
                          fVar8 * fVar17 + fVar9 * (in_XMM0_Dc - fVar5));
  auVar2._12_4_ =
       fVar7 * (fVar4 * (in_XMM7_Db - fVar6) + fVar16 * fVar18 + fVar14 * (in_XMM0_Dd - fVar5)) -
       fVar12 * (fVar10 * (in_XMM7_Db - fVar6) + fVar8 * fVar18 + fVar9 * (in_XMM0_Dd - fVar5));
  auVar3._4_4_ = fVar15;
  auVar3._0_4_ = fVar15;
  auVar3._8_4_ = fVar15;
  auVar3._12_4_ = fVar15;
  auVar3 = divps(auVar2,auVar3);
  VVar19.z = auVar3._0_4_;
  VVar19.y = auVar3._4_4_;
  VVar19.x = 1.0 - (auVar3._4_4_ + VVar19.z);
  return VVar19;
}

Assistant:

RMDEF Vector3 Vector3Barycenter(Vector3 p, Vector3 a, Vector3 b, Vector3 c)
{
    //Vector v0 = b - a, v1 = c - a, v2 = p - a;

    Vector3 v0 = Vector3Subtract(b, a);
    Vector3 v1 = Vector3Subtract(c, a);
    Vector3 v2 = Vector3Subtract(p, a);
    float d00 = Vector3DotProduct(v0, v0);
    float d01 = Vector3DotProduct(v0, v1);
    float d11 = Vector3DotProduct(v1, v1);
    float d20 = Vector3DotProduct(v2, v0);
    float d21 = Vector3DotProduct(v2, v1);

    float denom = d00*d11 - d01*d01;

    Vector3 result = { 0 };

    result.y = (d11*d20 - d01*d21)/denom;
    result.z = (d00*d21 - d01*d20)/denom;
    result.x = 1.0f - (result.z + result.y);

    return result;
}